

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

Maybe<kj::Exception> * __thiscall
kj::runCatchingExceptions<kj::(anonymous_namespace)::TestCase506::run()::__1>
          (Maybe<kj::Exception> *__return_storage_ptr__,kj *this,anon_class_16_2_7a0ebc2a *func)

{
  anon_class_16_2_7a0ebc2a *func_local;
  
  anon_unknown_0::TestCase506::run::anon_class_16_2_7a0ebc2a::operator()
            ((anon_class_16_2_7a0ebc2a *)this);
  Maybe<kj::Exception>::Maybe(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Maybe<Exception> runCatchingExceptions(Func&& func) {
  try {
    func();
    return kj::none;
  } catch (...) {
    return getCaughtExceptionAsKj();
  }
}